

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_cas2w(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  TCGv_i32 pTVar6;
  int nargs;
  TCGv_i32 *ppTVar7;
  abi_ptr_conflict addr;
  code *func;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *args [1];
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = cpu_lduw_code_m68k(env,s->pc);
  addr = s->pc + 2;
  s->pc = addr;
  if ((short)uVar3 < 0) {
    uVar4 = uVar3 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar4 & 1) == 0) {
      ppTVar7 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar7 = s->writeback;
    }
  }
  else {
    ppTVar7 = tcg_ctx->cpu_dregs;
    uVar4 = (uVar3 & 0xffff) >> 0xc;
  }
  pTVar1 = ppTVar7[uVar4];
  uVar5 = cpu_lduw_code_m68k(env,addr);
  s->pc = s->pc + 2;
  if ((short)uVar5 < 0) {
    uVar4 = uVar5 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar4 & 1) == 0) {
      ppTVar7 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar7 = s->writeback;
    }
  }
  else {
    ppTVar7 = tcg_ctx->cpu_dregs;
    uVar4 = (uVar5 & 0xffff) >> 0xc;
  }
  pTVar2 = ppTVar7[uVar4];
  pTVar6 = tcg_const_i32_m68k(tcg_ctx,(uVar3 & 7) << 9 | uVar3 >> 3 & 0x38 | uVar5 >> 6 & 7 |
                                      (uVar5 & 7) << 6);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  if ((((s->base).tb)->cflags & 0x80000) == 0) {
    local_50 = pTVar6 + (long)&tcg_ctx->pool_cur;
    local_48 = pTVar1 + (long)tcg_ctx;
    local_40 = pTVar2 + (long)tcg_ctx;
    func = helper_cas2w_m68k;
    nargs = 4;
  }
  else {
    func = helper_exit_atomic_m68k;
    nargs = 1;
  }
  tcg_gen_callN_m68k(tcg_ctx,func,(TCGTemp *)0x0,nargs,&local_58);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
  s->cc_op = CC_OP_CMPW;
  s->cc_op_synced = 1;
  return;
}

Assistant:

DISAS_INSN(cas2w)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext1, ext2;
    TCGv addr1, addr2;
    TCGv regs;

    /* cas2 Dc1:Dc2,Du1:Du2,(Rn1):(Rn2) */

    ext1 = read_im16(env, s);

    if (ext1 & 0x8000) {
        /* Address Register */
        addr1 = AREG(ext1, 12);
    } else {
        /* Data Register */
        addr1 = DREG(ext1, 12);
    }

    ext2 = read_im16(env, s);
    if (ext2 & 0x8000) {
        /* Address Register */
        addr2 = AREG(ext2, 12);
    } else {
        /* Data Register */
        addr2 = DREG(ext2, 12);
    }

    /*
     * if (R1) == Dc1 && (R2) == Dc2 then
     *     (R1) = Du1
     *     (R2) = Du2
     * else
     *     Dc1 = (R1)
     *     Dc2 = (R2)
     */

    regs = tcg_const_i32(tcg_ctx, REG(ext2, 6) |
                         (REG(ext1, 6) << 3) |
                         (REG(ext2, 0) << 6) |
                         (REG(ext1, 0) << 9));
    if (tb_cflags(s->base.tb) & CF_PARALLEL) {
        gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
    } else {
        gen_helper_cas2w(tcg_ctx, tcg_ctx->cpu_env, regs, addr1, addr2);
    }
    tcg_temp_free(tcg_ctx, regs);

    /* Note that cas2w also assigned to env->cc_op.  */
    s->cc_op = CC_OP_CMPW;
    s->cc_op_synced = 1;
}